

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

float ImGui::GetColumnWidth(int column_index)

{
  float fVar1;
  ImGuiOldColumns *columns_00;
  ImGuiOldColumnData *pIVar2;
  int in_EDI;
  ImVec2 IVar3;
  ImGuiOldColumns *columns;
  ImGuiWindow *window;
  ImGuiContext *g;
  float local_28;
  int local_8;
  float local_4;
  
  columns_00 = (GImGui->CurrentWindow->DC).CurrentColumns;
  if (columns_00 == (ImGuiOldColumns *)0x0) {
    IVar3 = GetContentRegionAvail();
    local_28 = IVar3.x;
    local_4 = local_28;
  }
  else {
    local_8 = in_EDI;
    if (in_EDI < 0) {
      local_8 = columns_00->Current;
    }
    pIVar2 = ImVector<ImGuiOldColumnData>::operator[](&columns_00->Columns,local_8 + 1);
    fVar1 = pIVar2->OffsetNorm;
    pIVar2 = ImVector<ImGuiOldColumnData>::operator[](&columns_00->Columns,local_8);
    local_4 = GetColumnOffsetFromNorm(columns_00,fVar1 - pIVar2->OffsetNorm);
  }
  return local_4;
}

Assistant:

float ImGui::GetColumnWidth(int column_index)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    if (columns == NULL)
        return GetContentRegionAvail().x;

    if (column_index < 0)
        column_index = columns->Current;
    return GetColumnOffsetFromNorm(columns, columns->Columns[column_index + 1].OffsetNorm - columns->Columns[column_index].OffsetNorm);
}